

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

int Ver_ParseSignalSuffix(Ver_Man_t *pMan,char *pWord,int *pnMsb,int *pnLsb)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *__nptr;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  
  sVar3 = strlen(pWord);
  if (pWord[(long)((sVar3 << 0x20) + -0x100000000) >> 0x20] != ']') {
    __assert_fail("pWord[Length-1] == \']\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                  ,0x2c0,"int Ver_ParseSignalSuffix(Ver_Man_t *, char *, int *, int *)");
  }
  lVar5 = (long)(sVar3 << 0x20) >> 0x20;
  pcVar6 = pWord + lVar5 + -2;
  bVar7 = pcVar6 == pWord;
  if (!bVar7) {
    lVar4 = lVar5 + -2;
    pcVar1 = pWord + lVar5;
    do {
      __nptr = pcVar1 + -1;
      if ((pcVar1[-2] == ':') || (pcVar1[-2] == '[')) {
        if (!bVar7) {
          if (pcVar1[-2] != ':') {
            if (pcVar1[-2] == '[') {
              iVar2 = atoi(__nptr);
              *pnLsb = iVar2;
              *pnMsb = iVar2;
              pcVar1[-2] = '\0';
              return 1;
            }
            __assert_fail("*pCur == \':\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                          ,0x2d1,"int Ver_ParseSignalSuffix(Ver_Man_t *, char *, int *, int *)");
          }
          iVar2 = atoi(__nptr);
          *pnLsb = iVar2;
          bVar7 = pcVar6 == pWord;
          if (!bVar7) {
            if (*pcVar6 == '[') goto LAB_0034e191;
            goto LAB_0034e16c;
          }
        }
        break;
      }
      lVar4 = lVar4 + -1;
      bVar7 = lVar4 == 0;
      pcVar1 = __nptr;
    } while (!bVar7);
  }
  goto LAB_0034e0f3;
  while (lVar5 = lVar4 + -1, pWord[lVar4 + -3] != '[') {
LAB_0034e16c:
    lVar4 = lVar5;
    bVar7 = lVar4 == 3;
    if (bVar7) goto LAB_0034e0f3;
  }
  pcVar6 = pWord + lVar4 + -3;
LAB_0034e191:
  if (!bVar7) {
    if (*pcVar6 == '[') {
      iVar2 = atoi(pcVar6 + 1);
      *pnMsb = iVar2;
      *pcVar6 = '\0';
      return 1;
    }
    __assert_fail("*pCur == \'[\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                  ,0x2de,"int Ver_ParseSignalSuffix(Ver_Man_t *, char *, int *, int *)");
  }
LAB_0034e0f3:
  sprintf(pMan->sError,"Cannot find opening bracket in signal name %s.",pWord);
  Ver_ParsePrintErrorMessage(pMan);
  return 0;
}

Assistant:

int Ver_ParseSignalSuffix( Ver_Man_t * pMan, char * pWord, int * pnMsb, int * pnLsb )
{
    char * pCur;
    int Length;
    Length = strlen(pWord);
    assert( pWord[Length-1] == ']' );
    // walk backward
    for ( pCur = pWord + Length - 2; pCur != pWord; pCur-- )
        if ( *pCur == ':' || *pCur == '[' )
            break;
    if ( pCur == pWord )
    {
        sprintf( pMan->sError, "Cannot find opening bracket in signal name %s.", pWord );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    if ( *pCur == '[' )
    {
        *pnMsb = *pnLsb = atoi(pCur+1);
        *pCur = 0;
        return 1;
    }
    assert( *pCur == ':' );
    // get the end of the interval
    *pnLsb = atoi(pCur+1);
    // find the beginning
    for ( pCur = pWord + Length - 2; pCur != pWord; pCur-- )
        if ( *pCur == '[' )
            break;
    if ( pCur == pWord )
    {
        sprintf( pMan->sError, "Cannot find opening bracket in signal name %s.", pWord );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    assert( *pCur == '[' );
    // get the beginning of the interval
    *pnMsb = atoi(pCur+1);
    // cut the word
    *pCur = 0;
    return 1;
}